

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> *this)

{
  QString *pQVar1;
  QString *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  
  pQVar1 = (this->a).a;
  pQVar2 = (this->a).b;
  if ((((pQVar1->d).ptr == (char16_t *)0x0) && ((pQVar2->d).ptr == (char16_t *)0x0)) &&
     ((this->b->d).ptr == (char16_t *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar3 = (pQVar2->d).size;
    lVar4 = (pQVar1->d).size;
    lVar5 = (this->b->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar3 + lVar4 + lVar5,Uninitialized);
    pcVar6 = (__return_storage_ptr__->d).ptr;
    pQVar1 = (this->a).a;
    lVar3 = (pQVar1->d).size;
    if (lVar3 != 0) {
      pcVar7 = (pQVar1->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(pcVar6,pcVar7,lVar3 * 2);
    }
    pcVar6 = pcVar6 + lVar3;
    pQVar1 = (this->a).b;
    lVar3 = (pQVar1->d).size;
    if (lVar3 != 0) {
      pcVar7 = (pQVar1->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(pcVar6,pcVar7,lVar3 * 2);
    }
    lVar4 = (this->b->d).size;
    if (lVar4 != 0) {
      pcVar7 = (this->b->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(pcVar6 + lVar3,pcVar7,lVar4 * 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }